

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 152.test.cpp
# Opt level: O3

void verifyChunkWithOneDilution(Type<2,_152> *chunk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pdVar9;
  uint uVar10;
  member_size_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  n;
  long lVar11;
  pointer pdVar12;
  pointer pdVar13;
  ulong uVar14;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_140;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0 [8];
  int local_d8;
  undefined4 uStack_d4;
  undefined1 local_c0 [9];
  bool bStack_b7;
  undefined6 uStack_b6;
  ITransientExpression *local_b0;
  WithinRelMatcher *local_a8;
  long local_a0;
  ITransientExpression local_98;
  iterator_t<CRng> *local_88;
  WithinRelMatcher *local_80;
  iterator_t<CRng> local_78;
  undefined1 *local_70;
  double local_68;
  iterator_t<CRng> local_60;
  undefined1 *local_58;
  iterator_t<CRng> local_50;
  undefined1 *local_48;
  iterator_t<CRng> local_40;
  undefined1 *local_38;
  
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xef;
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "152 == chunk.MT()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName,(SourceLineInfo *)local_f8,capturedExpression,ContinueOnFailure);
  local_f0._0_2_ = 0x101;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x98;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = 0x98;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf0;
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "152 == chunk.sectionNumber()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_00,(SourceLineInfo *)local_f8,capturedExpression_00,
             ContinueOnFailure);
  local_f0._0_2_ = 0x101;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x98;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = 0x98;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf2;
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "94239 == chunk.ZA()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_01,(SourceLineInfo *)local_f8,capturedExpression_01,
             ContinueOnFailure);
  iVar6 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_f0._1_1_ = iVar6 == 0x1701f;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x1701f;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf3;
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "94239 == chunk.targetIdentifier()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_02,(SourceLineInfo *)local_f8,capturedExpression_02,
             ContinueOnFailure);
  iVar6 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_f0._1_1_ = iVar6 == 0x1701f;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x1701f;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf4;
  capturedExpression_03.m_size = 0x25;
  capturedExpression_03.m_start = "2.369986e+2, WithinRel( chunk.AWR() )";
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_03,(SourceLineInfo *)local_f8,capturedExpression_03,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf5;
  capturedExpression_04.m_size = 0x33;
  capturedExpression_04.m_start = "2.369986e+2, WithinRel( chunk.atomicWeightRatio() )";
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_04,(SourceLineInfo *)local_f8,capturedExpression_04,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf7;
  capturedExpression_05.m_size = 0x11;
  capturedExpression_05.m_start = "1 == chunk.LSSF()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_05,(SourceLineInfo *)local_f8,capturedExpression_05,
             ContinueOnFailure);
  local_f0._1_1_ = chunk->lssf_;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d8360;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf8;
  capturedExpression_06.m_size = 0x1e;
  capturedExpression_06.m_start = "1 == chunk.selfShieldingOnly()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_06,(SourceLineInfo *)local_f8,capturedExpression_06,
             ContinueOnFailure);
  local_f0._1_1_ = chunk->lssf_;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d8360;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xf9;
  capturedExpression_07.m_size = 0x1a;
  capturedExpression_07.m_start = "2 == chunk.interpolation()";
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_07,(SourceLineInfo *)local_f8,capturedExpression_07,
             ContinueOnFailure);
  local_f0._1_1_ = chunk->interpolation_ == 2;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 2;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = chunk->interpolation_;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xfb;
  capturedExpression_08.m_size = 0x10;
  capturedExpression_08.m_start = "19 == chunk.NW()";
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_08,(SourceLineInfo *)local_f8,capturedExpression_08,
             ContinueOnFailure);
  iVar6 = (int)((ulong)((long)(chunk->data_).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_f0._1_1_ = iVar6 == 0x13;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x13;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xfc;
  capturedExpression_09.m_size = 0x1a;
  capturedExpression_09.m_start = "19 == chunk.numberValues()";
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_09,(SourceLineInfo *)local_f8,capturedExpression_09,
             ContinueOnFailure);
  iVar6 = (int)((ulong)((long)(chunk->data_).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_f0._1_1_ = iVar6 == 0x13;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 0x13;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xfe;
  capturedExpression_10.m_size = 0x12;
  capturedExpression_10.m_start = "5 == chunk.NREAC()";
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_10,(SourceLineInfo *)local_f8,capturedExpression_10,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_f0._1_1_ = iVar6 == 5;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 5;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0xff;
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "5 == chunk.numberReactions()";
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_11,(SourceLineInfo *)local_f8,capturedExpression_11,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_f0._1_1_ = iVar6 == 5;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 5;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x100;
  capturedExpression_12.m_size = 0x12;
  capturedExpression_12.m_start = "1 == chunk.NSIGZ()";
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_12,(SourceLineInfo *)local_f8,capturedExpression_12,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_f0._1_1_ = iVar6 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x101;
  capturedExpression_13.m_size = 0x1c;
  capturedExpression_13.m_start = "1 == chunk.numberDilutions()";
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_13,(SourceLineInfo *)local_f8,capturedExpression_13,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_f0._1_1_ = iVar6 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x102;
  capturedExpression_14.m_size = 0x11;
  capturedExpression_14.m_start = "3 == chunk.NUNR()";
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_14,(SourceLineInfo *)local_f8,capturedExpression_14,
             ContinueOnFailure);
  iVar6 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_f0._1_1_ = iVar6 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x103;
  capturedExpression_15.m_size = 0x1b;
  capturedExpression_15.m_start = "3 == chunk.numberEnergies()";
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_15,(SourceLineInfo *)local_f8,capturedExpression_15,
             ContinueOnFailure);
  iVar6 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_f0._1_1_ = iVar6 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d82e0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  local_d8 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x105;
  capturedExpression_16.m_size = 0x1d;
  capturedExpression_16.m_start = "0., WithinRel( chunk.TEMZ() )";
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_16,(SourceLineInfo *)local_f8,capturedExpression_16,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x106;
  capturedExpression_17.m_size = 0x24;
  capturedExpression_17.m_start = "0., WithinRel( chunk.temperature() )";
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_17,(SourceLineInfo *)local_f8,capturedExpression_17,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x108;
  capturedExpression_18.m_size = 0x18;
  capturedExpression_18.m_start = "1 == chunk.SIGZ().size()";
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_18,(SourceLineInfo *)local_f8,capturedExpression_18,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_f0._1_1_ = (uVar7 & 0xffffffff) == 1;
  local_f0._0_1_ = true;
  _local_d8 = SEXT48((int)uVar7);
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x109;
  capturedExpression_19.m_size = 0x1d;
  capturedExpression_19.m_start = "1 == chunk.dilutions().size()";
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_19,(SourceLineInfo *)local_f8,capturedExpression_19,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  _local_d8 = SEXT48((int)uVar7);
  local_f0._1_1_ = (uVar7 & 0xffffffff) == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x10a;
  capturedExpression_20.m_size = 0x23;
  capturedExpression_20.m_start = "1e+10, WithinRel( chunk.SIGZ()[0] )";
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_20,(SourceLineInfo *)local_f8,capturedExpression_20,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x10b;
  capturedExpression_21.m_size = 0x28;
  capturedExpression_21.m_start = "1e+10, WithinRel( chunk.dilutions()[0] )";
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_21,(SourceLineInfo *)local_f8,capturedExpression_21,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x10d;
  capturedExpression_22.m_size = 0x18;
  capturedExpression_22.m_start = "3 == chunk.EUNR().size()";
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_22,(SourceLineInfo *)local_f8,capturedExpression_22,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uVar7 = (ulong)(iVar6 * 5 + 1);
  _local_d8 = ((uVar7 + ((long)(chunk->data_).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)((chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar6) >> 3)) - 1) / uVar7;
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x10e;
  capturedExpression_23.m_size = 0x1c;
  capturedExpression_23.m_start = "3 == chunk.energies().size()";
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_23,(SourceLineInfo *)local_f8,capturedExpression_23,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uVar7 = (ulong)(iVar6 * 5 + 1);
  _local_d8 = ((uVar7 + ((long)(chunk->data_).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)((chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar6) >> 3)) - 1) / uVar7;
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x10f;
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "2500., WithinRel( chunk.EUNR()[0] )";
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_24,(SourceLineInfo *)local_f8,capturedExpression_24,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40a3880000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x110;
  capturedExpression_25.m_size = 0x23;
  capturedExpression_25.m_start = "2550., WithinRel( chunk.EUNR()[1] )";
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_25,(SourceLineInfo *)local_f8,capturedExpression_25,
             ContinueOnFailure);
  local_78._M_current = (double *)0x40a3ec0000000000;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_b0 = (ITransientExpression *)
             ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar6);
  unique0x00012000 =
       (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8 = (WithinRelMatcher *)(ulong)(iVar6 * 5 + 1);
  auVar1._8_8_ = (long)unique0x00012000 - (long)local_b0 >> 0x3f;
  auVar1._0_8_ = (long)unique0x00012000 - (long)local_b0 >> 3;
  lVar11 = SUB168(auVar1 % SEXT816((long)local_a8),0);
  local_a0 = (long)local_a8 - lVar11;
  if (lVar11 == 0) {
    local_a0 = 0;
  }
  local_60._M_current = (double *)local_b0;
  local_58 = local_c0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*local_60._M_current);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_78);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d8320;
  local_88 = &local_78;
  local_80 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x111;
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "30000., WithinRel( chunk.EUNR()[2] )";
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_26,(SourceLineInfo *)local_f8,capturedExpression_26,
             ContinueOnFailure);
  local_78._M_current = (double *)0x40dd4c0000000000;
  unique0x00012000 =
       (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_b0 = (ITransientExpression *)
             ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar6);
  local_a8 = (WithinRelMatcher *)(ulong)(iVar6 * 5 + 1);
  auVar2._8_8_ = (long)unique0x00012000 - (long)local_b0 >> 0x3f;
  auVar2._0_8_ = (long)unique0x00012000 - (long)local_b0 >> 3;
  lVar11 = SUB168(auVar2 % SEXT816((long)local_a8),0);
  local_a0 = (long)local_a8 - lVar11;
  if (lVar11 == 0) {
    local_a0 = 0;
  }
  local_50._M_current = (double *)local_b0;
  local_48 = local_c0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_48,&local_50,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*local_50._M_current);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_78);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d8320;
  local_88 = &local_78;
  local_80 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x112;
  capturedExpression_27.m_size = 0x27;
  capturedExpression_27.m_start = "2500., WithinRel( chunk.energies()[0] )";
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_27,(SourceLineInfo *)local_f8,capturedExpression_27,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40a3880000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x113;
  capturedExpression_28.m_size = 0x27;
  capturedExpression_28.m_start = "2550., WithinRel( chunk.energies()[1] )";
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_28,(SourceLineInfo *)local_f8,capturedExpression_28,
             ContinueOnFailure);
  local_78._M_current = (double *)0x40a3ec0000000000;
  unique0x00012000 =
       (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_b0 = (ITransientExpression *)
             ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar6);
  local_a8 = (WithinRelMatcher *)(ulong)(iVar6 * 5 + 1);
  auVar3._8_8_ = (long)unique0x00012000 - (long)local_b0 >> 0x3f;
  auVar3._0_8_ = (long)unique0x00012000 - (long)local_b0 >> 3;
  lVar11 = SUB168(auVar3 % SEXT816((long)local_a8),0);
  local_a0 = (long)local_a8 - lVar11;
  if (lVar11 == 0) {
    local_a0 = 0;
  }
  local_40._M_current = (double *)local_b0;
  local_38 = local_c0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_38,&local_40,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*local_40._M_current);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_78);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d8320;
  local_88 = &local_78;
  local_80 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x114;
  capturedExpression_29.m_size = 0x28;
  capturedExpression_29.m_start = "30000., WithinRel( chunk.energies()[2] )";
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_29,(SourceLineInfo *)local_f8,capturedExpression_29,
             ContinueOnFailure);
  local_68 = 30000.0;
  unique0x00012000 =
       (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_b0 = (ITransientExpression *)
             ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar6);
  local_a8 = (WithinRelMatcher *)(ulong)(iVar6 * 5 + 1);
  auVar4._8_8_ = (long)unique0x00012000 - (long)local_b0 >> 0x3f;
  auVar4._0_8_ = (long)unique0x00012000 - (long)local_b0 >> 3;
  lVar11 = SUB168(auVar4 % SEXT816((long)local_a8),0);
  local_a0 = (long)local_a8 - lVar11;
  if (lVar11 == 0) {
    local_a0 = 0;
  }
  local_78._M_current = (double *)local_b0;
  local_70 = local_c0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_70,&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*local_78._M_current);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,&local_68);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d8320;
  local_88 = (iterator_t<CRng> *)&local_68;
  local_80 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x116;
  capturedExpression_30.m_size = 0x19;
  capturedExpression_30.m_start = "3 == chunk.total().size()";
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_30,(SourceLineInfo *)local_f8,capturedExpression_30,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = (int)uVar7 *
           (int)(chunk->data_).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_d8 = (uVar7 / uVar10 + 1) - (ulong)(uVar7 % (ulong)uVar10 == 0);
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x117;
  capturedExpression_31.m_size = 0x1b;
  capturedExpression_31.m_start = "3 == chunk.elastic().size()";
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_31,(SourceLineInfo *)local_f8,capturedExpression_31,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = (int)uVar7 *
           (int)(chunk->data_).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_d8 = (uVar7 / uVar10 + 1) - (ulong)(uVar7 % (ulong)uVar10 == 0);
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x118;
  capturedExpression_32.m_size = 0x1b;
  capturedExpression_32.m_start = "3 == chunk.fission().size()";
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_32,(SourceLineInfo *)local_f8,capturedExpression_32,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = (int)uVar7 *
           (int)(chunk->data_).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_d8 = (uVar7 / uVar10 + 1) - (ulong)(uVar7 % (ulong)uVar10 == 0);
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x119;
  capturedExpression_33.m_size = 0x1b;
  capturedExpression_33.m_start = "3 == chunk.capture().size()";
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_33,(SourceLineInfo *)local_f8,capturedExpression_33,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = (int)uVar7 *
           (int)(chunk->data_).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_d8 = (uVar7 / uVar10 + 1) - (ulong)(uVar7 % (ulong)uVar10 == 0);
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11a;
  capturedExpression_34.m_size = 0x28;
  capturedExpression_34.m_start = "3 == chunk.currentWeightedTotal().size()";
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_34,(SourceLineInfo *)local_f8,capturedExpression_34,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = (int)uVar7 *
           (int)(chunk->data_).metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_d8 = (uVar7 / uVar10 + 1) - (ulong)(uVar7 % (ulong)uVar10 == 0);
  local_f0._1_1_ = _local_d8 == 3;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 3;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11b;
  capturedExpression_35.m_size = 0x1c;
  capturedExpression_35.m_start = "1 == chunk.total()[0].size()";
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_35,(SourceLineInfo *)local_f8,capturedExpression_35,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar14 = uVar7 & 0xffffffff;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar14) >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  _local_d8 = (long)(uVar7 * 8 + -8) >> 3;
  if (uVar14 < (ulong)_local_d8) {
    _local_d8 = uVar14;
  }
  local_f0._1_1_ = _local_d8 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11c;
  capturedExpression_36.m_size = 0x1e;
  capturedExpression_36.m_start = "1 == chunk.elastic()[0].size()";
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_36,(SourceLineInfo *)local_f8,capturedExpression_36,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar14 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar14 < uVar7) {
    uVar7 = uVar14;
  }
  pdVar9 = pdVar13 + uVar8 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8) {
    pdVar9 = pdVar13 + uVar7;
  }
  _local_d8 = (long)(pdVar13 + uVar7) - (long)pdVar9 >> 3;
  if (uVar8 < (ulong)_local_d8) {
    _local_d8 = uVar8;
  }
  local_f0._1_1_ = _local_d8 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11d;
  capturedExpression_37.m_size = 0x1e;
  capturedExpression_37.m_start = "1 == chunk.fission()[0].size()";
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_37,(SourceLineInfo *)local_f8,capturedExpression_37,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar14 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar14 < uVar7) {
    uVar7 = uVar14;
  }
  pdVar9 = pdVar13 + uVar8 * 2 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 2) {
    pdVar9 = pdVar13 + uVar7;
  }
  _local_d8 = (long)(pdVar13 + uVar7) - (long)pdVar9 >> 3;
  if (uVar8 < (ulong)_local_d8) {
    _local_d8 = uVar8;
  }
  local_f0._1_1_ = _local_d8 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11e;
  capturedExpression_38.m_size = 0x1e;
  capturedExpression_38.m_start = "1 == chunk.capture()[0].size()";
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_38,(SourceLineInfo *)local_f8,capturedExpression_38,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar14 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar14 < uVar7) {
    uVar7 = uVar14;
  }
  pdVar9 = pdVar13 + uVar8 * 3 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 3) {
    pdVar9 = pdVar13 + uVar7;
  }
  _local_d8 = (long)(pdVar13 + uVar7) - (long)pdVar9 >> 3;
  if (uVar8 < (ulong)_local_d8) {
    _local_d8 = uVar8;
  }
  local_f0._1_1_ = _local_d8 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x11f;
  capturedExpression_39.m_size = 0x2b;
  capturedExpression_39.m_start = "1 == chunk.currentWeightedTotal()[0].size()";
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_39,(SourceLineInfo *)local_f8,capturedExpression_39,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar14 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar14 < uVar7) {
    uVar7 = uVar14;
  }
  pdVar9 = pdVar13 + uVar8 * 4 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 4) {
    pdVar9 = pdVar13 + uVar7;
  }
  _local_d8 = (long)(pdVar13 + uVar7) - (long)pdVar9 >> 3;
  if (uVar8 < (ulong)_local_d8) {
    _local_d8 = uVar8;
  }
  local_f0._1_1_ = _local_d8 == 1;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83a0;
  local_f0._4_4_ = 1;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x120;
  capturedExpression_40.m_size = 0x2d;
  capturedExpression_40.m_start = "2.009120e+1, WithinRel( chunk.total()[0][0] )";
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_40,(SourceLineInfo *)local_f8,capturedExpression_40,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40341758e219652c;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_f8,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(ulong)(uint)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Tuple_impl<3UL,_long,_long,_long>.
                           super__Head_base<3UL,_long,_false>._M_head_impl + 1]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x121;
  capturedExpression_41.m_size = 0x2d;
  capturedExpression_41.m_start = "1.923568e+1, WithinRel( chunk.total()[1][0] )";
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_41,(SourceLineInfo *)local_f8,capturedExpression_41,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40333c558644523f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7) {
    pdVar9 = pdVar13;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[1]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x122;
  capturedExpression_42.m_size = 0x2d;
  capturedExpression_42.m_start = "1.366039e+1, WithinRel( chunk.total()[2][0] )";
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_42,(SourceLineInfo *)local_f8,capturedExpression_42,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x402b521ea35935fc;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7 * 2;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7 * 2) {
    pdVar9 = pdVar13;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[1]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x123;
  capturedExpression_43.m_size = 0x2f;
  capturedExpression_43.m_start = "1.343187e+1, WithinRel( chunk.elastic()[0][0] )";
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_43,(SourceLineInfo *)local_f8,capturedExpression_43,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x402add1e108c3f3e;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar14 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar14;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  uVar8 = uVar14 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar14) {
    uVar8 = uVar7;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar13[uVar8]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x124;
  capturedExpression_44.m_size = 0x2f;
  capturedExpression_44.m_start = "1.375705e+1, WithinRel( chunk.elastic()[1][0] )";
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_44,(SourceLineInfo *)local_f8,capturedExpression_44,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x402b839c0ebedfa4;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x125;
  capturedExpression_45.m_size = 0x2f;
  capturedExpression_45.m_start = "1.156033e+1, WithinRel( chunk.elastic()[2][0] )";
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_45,(SourceLineInfo *)local_f8,capturedExpression_45,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40271ee392e1ef74;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7 * 2;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7 * 2) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x126;
  capturedExpression_46.m_size = 0x2f;
  capturedExpression_46.m_start = "4.234708e+0, WithinRel( chunk.fission()[0][0] )";
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_46,(SourceLineInfo *)local_f8,capturedExpression_46,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x4010f0574b407033;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar14 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar14;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  lVar11 = uVar14 * 0x10 + 8;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar14 * 2) {
    lVar11 = uVar7 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*(double *)(lVar11 + (long)pdVar13));
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x127;
  capturedExpression_47.m_size = 0x2f;
  capturedExpression_47.m_start = "2.725074e+0, WithinRel( chunk.fission()[1][0] )";
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_47,(SourceLineInfo *)local_f8,capturedExpression_47,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x4005ccf398e97072;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 2 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 2) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x128;
  capturedExpression_48.m_size = 0x2f;
  capturedExpression_48.m_start = "1.572008e+0, WithinRel( chunk.fission()[2][0] )";
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_48,(SourceLineInfo *)local_f8,capturedExpression_48,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x3ff926f1dc50ce4f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7 * 2;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7 * 2) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 2 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 2) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x129;
  capturedExpression_49.m_size = 0x2f;
  capturedExpression_49.m_start = "2.424629e+0, WithinRel( chunk.capture()[0][0] )";
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_49,(SourceLineInfo *)local_f8,capturedExpression_49,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x400365a3e39f7729;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar14 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar14;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  uVar8 = uVar14 * 3 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar14 * 3) {
    uVar8 = uVar7;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar13[uVar8]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x12a;
  capturedExpression_50.m_size = 0x2f;
  capturedExpression_50.m_start = "2.753559e+0, WithinRel( chunk.capture()[1][0] )";
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_50,(SourceLineInfo *)local_f8,capturedExpression_50,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40060749f0e4da0a;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 3 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 3) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x12b;
  capturedExpression_51.m_size = 0x2f;
  capturedExpression_51.m_start = "5.280525e-1, WithinRel( chunk.capture()[2][0] )";
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_51,(SourceLineInfo *)local_f8,capturedExpression_51,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x3fe0e5ce5b4245f6;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7 * 2;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7 * 2) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 3 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 3) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x12c;
  capturedExpression_52.m_size = 0x3c;
  capturedExpression_52.m_start = "2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] )";
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_52,(SourceLineInfo *)local_f8,capturedExpression_52,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40341758e219652c;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar14 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar14;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  lVar11 = uVar14 * 0x20 + 8;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar14 * 4) {
    lVar11 = uVar7 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,*(double *)(lVar11 + (long)pdVar13));
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x12d;
  capturedExpression_53.m_size = 0x3c;
  capturedExpression_53.m_start = "1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] )";
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_53,(SourceLineInfo *)local_f8,capturedExpression_53,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x40333c558644523f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 4 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 4) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x12e;
  capturedExpression_54.m_size = 0x3c;
  capturedExpression_54.m_start = "1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] )";
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_54,(SourceLineInfo *)local_f8,capturedExpression_54,
             ContinueOnFailure);
  local_98._vptr_ITransientExpression = (_func_int **)0x402b521ea35935fc;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar12 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  pdVar9 = pdVar12 + uVar7 * 2;
  if ((ulong)((long)pdVar13 - (long)pdVar12 >> 3) <= uVar7 * 2) {
    pdVar9 = pdVar13;
  }
  uVar14 = (long)pdVar13 - (long)pdVar9 >> 3;
  if (uVar7 < uVar14) {
    uVar14 = uVar7;
  }
  uVar7 = uVar8 * 4 + 1;
  if ((ulong)((long)(uVar14 * 8 + -8) >> 3) <= uVar8 * 4) {
    uVar7 = uVar14;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_f8,pdVar9[uVar7]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_f8,(double *)&local_98)
  ;
  bStack_b7 = bVar5;
  local_c0[8] = true;
  local_c0._0_8_ = &PTR_streamReconstructedExpression_001d8320;
  local_b0 = &local_98;
  local_a8 = (WithinRelMatcher *)local_f8;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_f8 = (undefined1  [8])0x19a484;
  local_f0 = (pointer)0x130;
  capturedExpression_55.m_size = 0xf;
  capturedExpression_55.m_start = "6 == chunk.NC()";
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_140,macroName_55,(SourceLineInfo *)local_f8,capturedExpression_55,
             ContinueOnFailure);
  _local_d8 = (((long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 2;
  local_f0._1_1_ = _local_d8 == 6;
  local_f0._0_1_ = true;
  local_f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d83e0;
  local_f0._4_4_ = 6;
  local_e8 = "==";
  local_e0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_140,(ITransientExpression *)local_f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_f8);
  Catch::AssertionHandler::complete(&local_140);
  if (local_140.m_completed == false) {
    (*(local_140.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunkWithOneDilution( const section::Type< 2, 152 >& chunk ) {

  CHECK( 152 == chunk.MT() );
  CHECK( 152 == chunk.sectionNumber() );

  CHECK( 94239 == chunk.ZA() );
  CHECK( 94239 == chunk.targetIdentifier() );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( 1 == chunk.LSSF() );
  CHECK( 1 == chunk.selfShieldingOnly() );
  CHECK( 2 == chunk.interpolation() );

  CHECK( 19 == chunk.NW() );
  CHECK( 19 == chunk.numberValues() );

  CHECK( 5 == chunk.NREAC() );
  CHECK( 5 == chunk.numberReactions() );
  CHECK( 1 == chunk.NSIGZ() );
  CHECK( 1 == chunk.numberDilutions() );
  CHECK( 3 == chunk.NUNR() );
  CHECK( 3 == chunk.numberEnergies() );

  CHECK_THAT( 0., WithinRel( chunk.TEMZ() ) );
  CHECK_THAT( 0., WithinRel( chunk.temperature() ) );

  CHECK( 1 == chunk.SIGZ().size() );
  CHECK( 1 == chunk.dilutions().size() );
  CHECK_THAT( 1e+10, WithinRel( chunk.SIGZ()[0] ) );
  CHECK_THAT( 1e+10, WithinRel( chunk.dilutions()[0] ) );

  CHECK( 3 == chunk.EUNR().size() );
  CHECK( 3 == chunk.energies().size() );
  CHECK_THAT( 2500., WithinRel( chunk.EUNR()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.EUNR()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.EUNR()[2] ) );
  CHECK_THAT( 2500., WithinRel( chunk.energies()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.energies()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.energies()[2] ) );

  CHECK( 3 == chunk.total().size() );
  CHECK( 3 == chunk.elastic().size() );
  CHECK( 3 == chunk.fission().size() );
  CHECK( 3 == chunk.capture().size() );
  CHECK( 3 == chunk.currentWeightedTotal().size() );
  CHECK( 1 == chunk.total()[0].size() );
  CHECK( 1 == chunk.elastic()[0].size() );
  CHECK( 1 == chunk.fission()[0].size() );
  CHECK( 1 == chunk.capture()[0].size() );
  CHECK( 1 == chunk.currentWeightedTotal()[0].size() );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.total()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.total()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.total()[2][0] ) );
  CHECK_THAT( 1.343187e+1, WithinRel( chunk.elastic()[0][0] ) );
  CHECK_THAT( 1.375705e+1, WithinRel( chunk.elastic()[1][0] ) );
  CHECK_THAT( 1.156033e+1, WithinRel( chunk.elastic()[2][0] ) );
  CHECK_THAT( 4.234708e+0, WithinRel( chunk.fission()[0][0] ) );
  CHECK_THAT( 2.725074e+0, WithinRel( chunk.fission()[1][0] ) );
  CHECK_THAT( 1.572008e+0, WithinRel( chunk.fission()[2][0] ) );
  CHECK_THAT( 2.424629e+0, WithinRel( chunk.capture()[0][0] ) );
  CHECK_THAT( 2.753559e+0, WithinRel( chunk.capture()[1][0] ) );
  CHECK_THAT( 5.280525e-1, WithinRel( chunk.capture()[2][0] ) );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] ) );

  CHECK( 6 == chunk.NC() );
}